

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O3

void aros_setlnksym(GlobalVars *gv,Symbol *xdef)

{
  byte bVar1;
  LinkedSection *pLVar2;
  
  bVar1 = xdef->flags;
  if (((bVar1 & 1) != 0) && ((int)xdef->extra < 0)) {
    if ((xdef->extra & 0x7fffffff) == 0) {
      pLVar2 = smalldata_section(gv);
      xdef->relsect = (Section *)(pLVar2->sections).first;
      bVar1 = xdef->flags;
    }
    xdef->flags = bVar1 & 0xfe;
    return;
  }
  elf_setlnksym(gv,xdef);
  return;
}

Assistant:

static void aros_setlnksym(struct GlobalVars *gv,struct Symbol *xdef)
{
  if ((xdef->flags & SYMF_LNKSYM) && (xdef->extra & SYMX_SPECIAL)) {
    struct LinkedSection *ls;

    switch (xdef->extra & ~SYMX_SPECIAL) {
      case LINKERDB:
        ls = smalldata_section(gv);
        xdef->relsect = (struct Section *)ls->sections.first;
        break;
    }
    xdef->flags &= ~SYMF_LNKSYM;  /* do not init again */
  }
  else
    elf_setlnksym(gv,xdef);
}